

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor)

{
  FileDescriptor *in_RDX;
  string local_30;
  
  this->descriptor_ = descriptor;
  (this->scope_)._M_dataplus._M_p = (pointer)&(this->scope_).field_2;
  (this->scope_)._M_string_length = 0;
  (this->scope_).field_2._M_local_buf[0] = '\0';
  if (*(java **)(descriptor + 0x40) == (java *)0x0) {
    ClassName_abi_cxx11_(&local_30,*(java **)(descriptor + 0x20),in_RDX);
  }
  else {
    ClassName_abi_cxx11_(&local_30,*(java **)(descriptor + 0x40),(Descriptor *)in_RDX);
  }
  std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor)
  : descriptor_(descriptor) {
  if (descriptor_->extension_scope() != NULL) {
    scope_ = ClassName(descriptor_->extension_scope());
  } else {
    scope_ = ClassName(descriptor_->file());
  }
}